

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall ON_NurbsCage::Write(ON_NurbsCage *this,ON_BinaryArchive *archive)

{
  long lVar1;
  ON_BinaryArchive *pOVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  double *p;
  ulong count;
  int j;
  ulong uVar7;
  int k;
  double adStack_50 [2];
  double *local_40;
  ON_BinaryArchive *local_38;
  
  adStack_50[0] = 2.77886876657457e-317;
  bVar3 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (!bVar3) {
    return false;
  }
  adStack_50[0] = 2.77887914195313e-317;
  bVar3 = ON_BinaryArchive::WriteInt(archive,this->m_dim);
  uVar7 = 0;
  bVar4 = false;
  if (!bVar3) goto LAB_0055d3ce;
  adStack_50[0] = 2.77889594018509e-317;
  bVar3 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_is_rat);
  if (bVar3) {
    adStack_50[0] = 2.77890631556365e-317;
    bVar3 = ON_BinaryArchive::WriteInt(archive,this->m_order[0]);
    if (bVar3) {
      adStack_50[0] = 2.77891669094222e-317;
      bVar3 = ON_BinaryArchive::WriteInt(archive,this->m_order[1]);
      if (bVar3) {
        adStack_50[0] = 2.77892706632078e-317;
        bVar3 = ON_BinaryArchive::WriteInt(archive,this->m_order[2]);
        if (bVar3) {
          adStack_50[0] = 2.77893744169934e-317;
          bVar3 = ON_BinaryArchive::WriteInt(archive,this->m_cv_count[0]);
          if (bVar3) {
            adStack_50[0] = 2.7789478170779e-317;
            bVar3 = ON_BinaryArchive::WriteInt(archive,this->m_cv_count[1]);
            if (bVar3) {
              adStack_50[0] = 2.77895621619388e-317;
              bVar3 = ON_BinaryArchive::WriteInt(archive,this->m_cv_count[2]);
              if (bVar3) {
                bVar4 = false;
                adStack_50[0] = 2.77896461530986e-317;
                iVar5 = KnotCount(this,0);
                adStack_50[0] = 2.7789725203602e-317;
                bVar3 = ON_BinaryArchive::WriteDouble(archive,(long)iVar5,this->m_knot[0]);
                if (!bVar3) goto LAB_0055d3ce;
                adStack_50[0] = 2.77898289573876e-317;
                iVar5 = KnotCount(this,1);
                adStack_50[0] = 2.77899080078909e-317;
                bVar3 = ON_BinaryArchive::WriteDouble(archive,(long)iVar5,this->m_knot[1]);
                if (bVar3) {
                  adStack_50[0] = 2.77899821177378e-317;
                  iVar5 = KnotCount(this,2);
                  adStack_50[0] = 2.77900611682411e-317;
                  bVar4 = ON_BinaryArchive::WriteDouble(archive,(long)iVar5,this->m_knot[2]);
                  goto LAB_0055d3ce;
                }
              }
            }
          }
        }
      }
    }
  }
  bVar4 = false;
LAB_0055d3ce:
  count = (long)this->m_dim + (ulong)this->m_is_rat;
  lVar1 = -(count * 8 + 0xf & 0xfffffffffffffff0);
  local_40 = (double *)((long)adStack_50 + lVar1 + 8);
  uVar6 = 0;
  if (0 < (int)count) {
    uVar6 = count & 0xffffffff;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    local_40[uVar7] = -1.23432101234321e+308;
  }
  iVar5 = 0;
  local_38 = archive;
  while ((pOVar2 = local_38, iVar5 < this->m_cv_count[0] && (bVar4 != false))) {
    j = 0;
    while ((j < this->m_cv_count[1] && (bVar4 != false))) {
      k = 0;
      while ((k < this->m_cv_count[2] && (bVar4 != false))) {
        *(undefined8 *)((long)adStack_50 + lVar1) = 0x55d45d;
        p = CV(this,iVar5,j,k);
        pOVar2 = local_38;
        if (p == (double *)0x0) {
          p = local_40;
        }
        *(undefined8 *)((long)adStack_50 + lVar1) = 0x55d474;
        bVar4 = ON_BinaryArchive::WriteDouble(pOVar2,count,p);
        k = k + 1;
      }
      j = j + 1;
    }
    iVar5 = iVar5 + 1;
  }
  *(undefined8 *)((long)adStack_50 + lVar1) = 0x55d491;
  bVar3 = ON_BinaryArchive::EndWrite3dmChunk(pOVar2);
  return (bool)(bVar3 & bVar4);
}

Assistant:

bool ON_NurbsCage::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);

  if (rc)
  {
    rc = archive.WriteInt(m_dim);
    if(rc)
      rc = archive.WriteInt(m_is_rat);

    if (rc)
      rc = archive.WriteInt(m_order[0]);
    if (rc)
      rc = archive.WriteInt(m_order[1]);
    if (rc)
      rc = archive.WriteInt(m_order[2]);

    if (rc)
      rc = archive.WriteInt(m_cv_count[0]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[1]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[2]);

    if (rc)
      rc = archive.WriteDouble(KnotCount(0),m_knot[0]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(1),m_knot[1]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(2),m_knot[2]);

    int i,j,k;
    const int cv_dim = m_is_rat?(m_dim+1):m_dim;
    double* bogus_cv = (double*)alloca(cv_dim*sizeof(*bogus_cv));
    for ( i = 0; i < cv_dim; i++ )
      bogus_cv[i] = ON_UNSET_VALUE;
    for(i = 0; i < m_cv_count[0] && rc; i++)
    {
      for(j = 0; j < m_cv_count[1] && rc; j++)
      {
        for ( k = 0; k < m_cv_count[2] && rc; k++)
        {
          const double* cv = CV(i,j,k);
          if ( !cv )
            cv = bogus_cv;
          rc = archive.WriteDouble(cv_dim,cv);
        }
      }
    }

    if ( !archive.EndWrite3dmChunk() )
    {
      rc = false;
    }
  }

  return rc;
}